

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  REF_BOOL increase_fuzz;
  REF_BOOL local_34;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar1 = ref_interp->to_grid->node;
  if ((ref_interp->instrument == 0) || (uVar3 = ref_mpi_stopwatch_start(ref_mpi), uVar3 == 0)) {
    iVar6 = pRVar1->max;
    if (0 < iVar6) {
      lVar7 = 0;
      do {
        if (((-1 < pRVar1->global[lVar7]) && (pRVar1->ref_mpi->id == pRVar1->part[lVar7])) &&
           (ref_interp->cell[lVar7] != -1)) {
          uVar3 = ref_interp_push_onto_queue(ref_interp,(REF_INT)lVar7);
          if (uVar3 != 0) {
            pcVar5 = "queue neighbors";
            uVar4 = 0x6e2;
            goto LAB_0016d850;
          }
          iVar6 = pRVar1->max;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar6);
    }
    uVar3 = ref_interp_process_agents(ref_interp);
    if (uVar3 == 0) {
      if ((ref_interp->instrument == 0) ||
         (uVar3 = ref_mpi_stopwatch_stop(ref_mpi,"drain"), uVar3 == 0)) {
        local_34 = 0;
        bVar2 = true;
        iVar6 = 0xc;
        while( true ) {
          if ((!bVar2) &&
             (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, ref_mpi->id == 0)) {
            printf("retry tree search with %e fuzz\n");
          }
          uVar3 = ref_interp_tree(ref_interp,&local_34);
          if (uVar3 != 0) break;
          if ((ref_interp->instrument != 0) &&
             (uVar3 = ref_mpi_stopwatch_stop(ref_mpi,"tree"), uVar3 != 0)) {
            pcVar5 = "locate clock";
            uVar4 = 0x6f4;
            goto LAB_0016d850;
          }
          if ((long)local_34 == 0) {
            return 0;
          }
          bVar2 = false;
          iVar6 = iVar6 + -1;
          if (iVar6 == 0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x6f7,"ref_interp_locate_warm","unable to grow fuzz to find tree candidate",0,
                   (long)local_34);
            return 1;
          }
        }
        pcVar5 = "tree";
        uVar4 = 0x6f2;
      }
      else {
        pcVar5 = "locate clock";
        uVar4 = 0x6e8;
      }
    }
    else {
      pcVar5 = "drain";
      uVar4 = 0x6e6;
    }
  }
  else {
    pcVar5 = "locate clock";
    uVar4 = 0x6de;
  }
LAB_0016d850:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar4,
         "ref_interp_locate_warm",(ulong)uVar3,pcVar5);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_BOOL increase_fuzz;
  REF_INT tries;
  REF_INT node;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    }
  }

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}